

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

bool google::SafeGetEnv(char *varname,string *valstr)

{
  char *pcVar1;
  char *val;
  string *valstr_local;
  char *varname_local;
  
  pcVar1 = getenv(varname);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)valstr,pcVar1);
  }
  return pcVar1 != (char *)0x0;
}

Assistant:

inline bool SafeGetEnv(const char *varname, std::string &valstr)
{
#if defined(_MSC_VER) && _MSC_VER >= 1400
	char  *val;
	size_t sz;
	if (_dupenv_s(&val, &sz, varname) != 0 || !val) return false;
	valstr = val;
	free(val);
#else
	const char * const val = getenv(varname);
	if (!val) return false;
	valstr = val;
#endif
	return true;
}